

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool lunasvg::parseCombinator(string_view *input,Combinator *combinator)

{
  bool bVar1;
  const_reference pvVar2;
  undefined1 local_19;
  Combinator *combinator_local;
  string_view *input_local;
  
  *combinator = None;
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(input);
    local_19 = false;
    if (!bVar1) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(input);
      local_19 = IS_WS((int)*pvVar2);
    }
    if (local_19 == false) break;
    *combinator = Descendant;
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(input,1);
  }
  bVar1 = skipDelimiterAndOptionalSpaces(input,'>');
  if (bVar1) {
    *combinator = Child;
  }
  else {
    bVar1 = skipDelimiterAndOptionalSpaces(input,'+');
    if (bVar1) {
      *combinator = DirectAdjacent;
    }
    else {
      bVar1 = skipDelimiterAndOptionalSpaces(input,'~');
      if (bVar1) {
        *combinator = InDirectAdjacent;
      }
    }
  }
  return *combinator != None;
}

Assistant:

static bool parseCombinator(std::string_view& input, SimpleSelector::Combinator& combinator)
{
    combinator = SimpleSelector::Combinator::None;
    while(!input.empty() && IS_WS(input.front())) {
        combinator = SimpleSelector::Combinator::Descendant;
        input.remove_prefix(1);
    }

    if(skipDelimiterAndOptionalSpaces(input, '>'))
        combinator = SimpleSelector::Combinator::Child;
    else if(skipDelimiterAndOptionalSpaces(input, '+'))
        combinator = SimpleSelector::Combinator::DirectAdjacent;
    else if(skipDelimiterAndOptionalSpaces(input, '~'))
        combinator = SimpleSelector::Combinator::InDirectAdjacent;
    return combinator != SimpleSelector::Combinator::None;
}